

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_unset_compression_param(fitsfile *fptr,int *status)

{
  FITSfile *pFVar1;
  long lVar2;
  
  pFVar1 = fptr->Fptr;
  pFVar1->compress_type = 0;
  pFVar1->quantize_level = 0.0;
  pFVar1->quantize_method = 0;
  pFVar1->dither_seed = 0;
  pFVar1->hcomp_scale = 0.0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    pFVar1->tilesize[lVar2] = 0;
  }
  return *status;
}

Assistant:

int fits_unset_compression_param(
      fitsfile *fptr,
      int *status) 
{
    int ii;

    (fptr->Fptr)->compress_type = 0;
    (fptr->Fptr)->quantize_level = 0;
    (fptr->Fptr)->quantize_method = 0;
    (fptr->Fptr)->dither_seed = 0; 
    (fptr->Fptr)->hcomp_scale = 0;

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        (fptr->Fptr)->tilesize[ii] = 0;
    }

    return(*status);
}